

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

FILE * phosg::fopen_binary_raw(string *filename,string *mode)

{
  size_type sVar1;
  char *__filename;
  char *__modes;
  FILE *pFVar2;
  cannot_open_file *this;
  FILE *f;
  undefined1 local_38 [8];
  string new_mode;
  string *mode_local;
  string *filename_local;
  
  new_mode.field_2._8_8_ = mode;
  ::std::__cxx11::string::string
            ((string *)local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)mode);
  sVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                     'b',0);
  if (sVar1 == 0xffffffffffffffff) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,'b');
  }
  __filename = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)filename);
  __modes = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                      );
  pFVar2 = fopen(__filename,__modes);
  if (pFVar2 == (FILE *)0x0) {
    this = (cannot_open_file *)__cxa_allocate_exception(0x20);
    cannot_open_file::cannot_open_file(this,filename);
    __cxa_throw(this,&cannot_open_file::typeinfo,cannot_open_file::~cannot_open_file);
  }
  ::std::__cxx11::string::~string((string *)local_38);
  return (FILE *)pFVar2;
}

Assistant:

static FILE* fopen_binary_raw(const string& filename, const string& mode) {
  string new_mode = mode;
  if (new_mode.find('b') == string::npos) {
    new_mode += 'b';
  }
  FILE* f = fopen(filename.c_str(), new_mode.c_str());
  if (!f) {
    throw cannot_open_file(filename);
  }
  return f;
}